

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprCheckIN(Parse *pParse,Expr *pIn)

{
  int iVar1;
  long in_RSI;
  int nVector;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  
  iVar1 = sqlite3ExprVectorSize(*(Expr **)(in_RSI + 0x10));
  if ((*(uint *)(in_RSI + 4) & 0x800) == 0) {
    if (iVar1 != 1) {
      sqlite3VectorErrorMsg
                ((Parse *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
                 (Expr *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      return 1;
    }
  }
  else if (iVar1 != *(int *)**(undefined8 **)(in_RSI + 0x20)) {
    sqlite3SubselectError
              ((Parse *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc,
               in_stack_ffffffffffffffd8);
    return 1;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCheckIN(Parse *pParse, Expr *pIn){
  int nVector = sqlite3ExprVectorSize(pIn->pLeft);
  if( (pIn->flags & EP_xIsSelect) ){
    if( nVector!=pIn->x.pSelect->pEList->nExpr ){
      sqlite3SubselectError(pParse, pIn->x.pSelect->pEList->nExpr, nVector);
      return 1;
    }
  }else if( nVector!=1 ){
    sqlite3VectorErrorMsg(pParse, pIn->pLeft);
    return 1;
  }
  return 0;
}